

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O1

void anon_unknown.dwarf_1b2b50::raise_cannot_create_fifo(czstring path,int errcode)

{
  ostringstream str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Could not create FIFO at ",0x19);
  local_1b0._M_string_length._0_2_ = 0x22;
  local_1b0._M_dataplus._M_p = path;
  std::__detail::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)local_190,
             (_Quoted_string<const_char_*,_char> *)&local_1b0);
  std::__cxx11::stringbuf::str();
  pstore::raise<pstore::errno_erc,std::__cxx11::string>((errno_erc)errcode,&local_1b0);
}

Assistant:

PSTORE_NO_RETURN void raise_cannot_create_fifo (pstore::gsl::czstring const path,
                                                    int const errcode) {
        std::ostringstream str;
        str << "Could not create FIFO at " << pstore::quoted (path);
        raise (pstore::errno_erc{errcode}, str.str ());
    }